

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void av1_loop_restoration_filter_frame_init
               (AV1LrStruct *lr_ctxt,YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,
               int num_planes)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  aom_bit_depth_t aVar4;
  RestorationType RVar5;
  SequenceHeader *pSVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  uint use_highbitdepth;
  int width;
  long lVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  ulong uVar15;
  
  pSVar6 = cm->seq_params;
  aVar4 = pSVar6->bit_depth;
  bVar3 = pSVar6->use_highbitdepth;
  lr_ctxt->dst = &cm->rst_frame;
  use_highbitdepth = (uint)bVar3;
  iVar8 = aom_realloc_frame_buffer
                    (&cm->rst_frame,(frame->field_2).field_0.y_crop_width,
                     (frame->field_3).field_0.y_crop_height,pSVar6->subsampling_x,
                     pSVar6->subsampling_y,use_highbitdepth,0x20,(cm->features).byte_alignment,
                     (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                     false,0);
  if (iVar8 != 0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate restoration dst buffer");
  }
  lr_ctxt->on_rest_unit = filter_frame_on_unit;
  lr_ctxt->frame = frame;
  if (0 < num_planes) {
    piVar10 = &lr_ctxt->ctxt[0].dst_stride;
    lVar11 = 0;
    lVar12 = 0;
    do {
      (&cm->rst_info[0].optimized_lr)[lVar12 * 2] = optimized_lr;
      RVar5 = (&cm->rst_info[0].frame_restoration_type)[lVar12 * 2];
      ((FilterFrameCtxt *)(piVar10 + -0xd))->rsi =
           (RestorationInfo *)((long)&cm->rst_info[0].frame_restoration_type + lVar11);
      if (RVar5 != RESTORE_NONE) {
        if (lVar12 == 0) {
          bVar13 = false;
          bVar14 = false;
        }
        else {
          bVar13 = cm->seq_params->subsampling_x != 0;
          bVar14 = cm->seq_params->subsampling_y != 0;
        }
        width = (int)(((uint)(1 << bVar13) >> 1) + cm->superres_upscaled_width) >> bVar13;
        iVar8 = (int)(((uint)(1 << bVar14) >> 1) + cm->height) >> bVar14;
        av1_extend_frame(*(uint8_t **)((long)frame->store_buf_adr + lVar12 + -0x20),width,iVar8,
                         *(int *)((long)frame->store_buf_adr + (ulong)(lVar12 != 0) * 4 + -0x28),3,3
                         ,use_highbitdepth);
        if (lVar12 == 0) {
          uVar15 = 0;
        }
        else {
          uVar1 = pSVar6->subsampling_x;
          uVar2 = pSVar6->subsampling_y;
          uVar15 = ~CONCAT44(-(uint)(uVar2 == 0),-(uint)(uVar1 == 0)) & (ulong)DAT_0050baf0;
        }
        *(ulong *)(piVar10 + -0xb) = uVar15;
        piVar10[-9] = width;
        piVar10[-8] = iVar8;
        piVar10[-7] = use_highbitdepth;
        piVar10[-6] = aVar4;
        *(uint8_t **)(piVar10 + -5) = *(uint8_t **)((long)frame->store_buf_adr + lVar12 + -0x20);
        pYVar7 = lr_ctxt->dst;
        *(uint8_t **)(piVar10 + -3) = *(uint8_t **)((long)pYVar7->store_buf_adr + lVar12 + -0x20);
        lVar9 = (ulong)(lVar12 != 0) * 4;
        piVar10[-1] = *(int *)((long)frame->store_buf_adr + lVar9 + -0x28);
        *piVar10 = *(int *)((long)pYVar7->store_buf_adr + lVar9 + -0x28);
      }
      lVar12 = lVar12 + 8;
      piVar10 = piVar10 + 0xe;
      lVar11 = lVar11 + 0x40;
    } while ((ulong)(uint)num_planes << 3 != lVar12);
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_frame_init(AV1LrStruct *lr_ctxt,
                                            YV12_BUFFER_CONFIG *frame,
                                            AV1_COMMON *cm, int optimized_lr,
                                            int num_planes) {
  const SequenceHeader *const seq_params = cm->seq_params;
  const int bit_depth = seq_params->bit_depth;
  const int highbd = seq_params->use_highbitdepth;
  lr_ctxt->dst = &cm->rst_frame;

  const int frame_width = frame->crop_widths[0];
  const int frame_height = frame->crop_heights[0];
  if (aom_realloc_frame_buffer(
          lr_ctxt->dst, frame_width, frame_height, seq_params->subsampling_x,
          seq_params->subsampling_y, highbd, AOM_RESTORATION_FRAME_BORDER,
          cm->features.byte_alignment, NULL, NULL, NULL, false,
          0) != AOM_CODEC_OK)
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate restoration dst buffer");

  lr_ctxt->on_rest_unit = filter_frame_on_unit;
  lr_ctxt->frame = frame;
  for (int plane = 0; plane < num_planes; ++plane) {
    RestorationInfo *rsi = &cm->rst_info[plane];
    RestorationType rtype = rsi->frame_restoration_type;
    rsi->optimized_lr = optimized_lr;
    lr_ctxt->ctxt[plane].rsi = rsi;

    if (rtype == RESTORE_NONE) {
      continue;
    }

    const int is_uv = plane > 0;
    int plane_w, plane_h;
    av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);
    assert(plane_w == frame->crop_widths[is_uv]);
    assert(plane_h == frame->crop_heights[is_uv]);

    av1_extend_frame(frame->buffers[plane], plane_w, plane_h,
                     frame->strides[is_uv], RESTORATION_BORDER,
                     RESTORATION_BORDER, highbd);

    FilterFrameCtxt *lr_plane_ctxt = &lr_ctxt->ctxt[plane];
    lr_plane_ctxt->ss_x = is_uv && seq_params->subsampling_x;
    lr_plane_ctxt->ss_y = is_uv && seq_params->subsampling_y;
    lr_plane_ctxt->plane_w = plane_w;
    lr_plane_ctxt->plane_h = plane_h;
    lr_plane_ctxt->highbd = highbd;
    lr_plane_ctxt->bit_depth = bit_depth;
    lr_plane_ctxt->data8 = frame->buffers[plane];
    lr_plane_ctxt->dst8 = lr_ctxt->dst->buffers[plane];
    lr_plane_ctxt->data_stride = frame->strides[is_uv];
    lr_plane_ctxt->dst_stride = lr_ctxt->dst->strides[is_uv];
  }
}